

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O3

GetElementPtrInst * __thiscall
dg::vr::ValueRelations::getInstance<llvm::GetElementPtrInst>(ValueRelations *this,Handle h)

{
  Value *pVVar1;
  VectorSet<const_llvm::Value_*> *pVVar2;
  pointer ppVVar3;
  
  pVVar2 = getEqual(this,h);
  ppVVar3 = (pVVar2->vec).
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (ppVVar3 ==
        (pVVar2->vec).super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      return (GetElementPtrInst *)0x0;
    }
    pVVar1 = *ppVVar3;
    if ((pVVar1 != (Value *)0x0) && (pVVar1[0x10] == (Value)0x3d)) break;
    ppVVar3 = ppVVar3 + 1;
  }
  return (GetElementPtrInst *)pVVar1;
}

Assistant:

const I *getInstance(Handle h) const {
        for (const auto *val : getEqual(h)) {
            if (const auto *inst = llvm::dyn_cast<I>(val))
                return inst;
        }
        return nullptr;
    }